

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

bool __thiscall
OpenMD::SelectionEvaluator::loadScriptFileInternal(SelectionEvaluator *this,string *filename)

{
  bool bVar1;
  long *plVar2;
  string script;
  ifstrstream ifs;
  char buffer [65535];
  
  ifstrstream::ifstrstream(&ifs,(filename->_M_dataplus)._M_p,_S_in,false);
  bVar1 = ifstrstream::is_open(&ifs);
  if (bVar1) {
    script._M_dataplus._M_p = (pointer)&script.field_2;
    script._M_string_length = 0;
    script.field_2._M_local_buf[0] = '\0';
    while( true ) {
      plVar2 = (long *)std::istream::getline((char *)&ifs,(long)buffer);
      if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
      std::__cxx11::string::append((char *)&script);
    }
    bVar1 = loadScript(this,filename,&script);
    std::__cxx11::string::~string((string *)&script);
  }
  else {
    bVar1 = false;
  }
  ifstrstream::~ifstrstream(&ifs);
  return bVar1;
}

Assistant:

bool SelectionEvaluator::loadScriptFileInternal(const std::string& filename) {
    ifstrstream ifs(filename.c_str());
    if (!ifs.is_open()) { return false; }

    const int bufferSize = 65535;
    char buffer[bufferSize];
    std::string script;
    while (ifs.getline(buffer, bufferSize)) {
      script += buffer;
    }
    return loadScript(filename, script);
  }